

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.c
# Opt level: O3

char * vrna_cut_point_insert(char *string,int cp)

{
  size_t sVar1;
  char *pcVar2;
  
  if (0 < cp) {
    sVar1 = strlen(string);
    pcVar2 = (char *)vrna_alloc((int)sVar1 + 2);
    strncpy(pcVar2,string,(ulong)(cp - 1));
    pcVar2[cp - 1] = '&';
    pcVar2 = strcat(pcVar2,string + ((ulong)(uint)cp - 1));
    return pcVar2;
  }
  pcVar2 = strdup(string);
  return pcVar2;
}

Assistant:

PUBLIC char *
vrna_cut_point_insert(const char  *string,
                      int         cp)
{
  char  *ctmp;
  int   len;

  if (cp > 0) {
    len   = strlen(string);
    ctmp  = (char *)vrna_alloc((len + 2) * sizeof(char));
    /* first sequence */
    (void)strncpy(ctmp, string, cp - 1);
    /* spacer */
    ctmp[cp - 1] = '&';
    /* second sequence */
    (void)strcat(ctmp, string + cp - 1);
  } else {
    ctmp = strdup(string);
  }

  return ctmp;
}